

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

__pid_t __thiscall kj::UnixEventPort::wait(UnixEventPort *this,void *__stat_loc)

{
  bool bVar1;
  int iVar2;
  Duration unit;
  int *piVar3;
  undefined7 extraout_var;
  long lVar4;
  undefined4 __timeout;
  sigset_t *psVar5;
  sigset_t *psVar6;
  SignalPromiseAdapter *pSVar7;
  long in_FS_OFFSET;
  byte bVar8;
  Fault f;
  sigset_t waitMask;
  epoll_event events [16];
  undefined4 extraout_var_00;
  
  bVar8 = 0;
  this->sleeping = false;
  unit.value._0_4_ = (**this->clock->_vptr_MonotonicClock)();
  unit.value._4_4_ = extraout_var_00;
  TimerImpl::timeoutToNextEvent((TimerImpl *)events,(TimePoint)&this->timerImpl,unit,1000000);
  __timeout = events[0].data.u64._4_4_;
  if ((char)events[0].events == '\0') {
    __timeout = -1;
  }
  pSVar7 = this->signalHead;
  if ((this->childSet).ptr.ptr == (ChildSet *)0x0 && pSVar7 == (SignalPromiseAdapter *)0x0) {
    iVar2 = epoll_wait((this->epollFd).fd,(epoll_event *)events,0x10,__timeout);
  }
  else {
    psVar5 = &this->originalMask;
    psVar6 = (sigset_t *)&waitMask;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      psVar6->__val[0] = psVar5->__val[0];
      psVar5 = (sigset_t *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
      psVar6 = (sigset_t *)((long)psVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    for (; pSVar7 != (SignalPromiseAdapter *)0x0; pSVar7 = pSVar7->next) {
      do {
        iVar2 = sigdelset((sigset_t *)&waitMask,pSVar7->signum);
        if (-1 < iVar2) goto LAB_003ef5a3;
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x25e,iVar2,"sigdelset(&waitMask, ptr->signum)","");
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_003ef5a3:
    }
    if ((this->childSet).ptr.ptr != (ChildSet *)0x0) {
      do {
        iVar2 = sigdelset((sigset_t *)&waitMask,0x11);
        if (-1 < iVar2) goto LAB_003ef5df;
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x262,iVar2,"sigdelset(&waitMask, SIGCHLD)","");
        kj::_::Debug::Fault::fatal(&f);
      }
    }
LAB_003ef5df:
    *(UnixEventPort **)(in_FS_OFFSET + -0x20) = this;
    iVar2 = epoll_pwait((this->epollFd).fd,(epoll_event *)events,0x10,__timeout,
                        (__sigset_t *)&waitMask);
    *(undefined8 *)(in_FS_OFFSET + -0x20) = 0;
  }
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    iVar2 = 0;
    if (*piVar3 != 4) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&waitMask,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x277,*piVar3,"epoll_pwait()","");
      kj::_::Debug::Fault::fatal((Fault *)&waitMask);
    }
  }
  bVar1 = processEpollEvents(this,events,iVar2);
  return (__pid_t)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool UnixEventPort::wait() {
  sleeping = false;

#ifdef KJ_DEBUG
  // In debug mode, verify the current signal mask matches the original.
  {
    sigset_t currentMask;
    memset(&currentMask, 0, sizeof(currentMask));
    KJ_SYSCALL(sigprocmask(0, nullptr, &currentMask));
    if (arrayPtr(currentMask).asBytes() != arrayPtr(originalMask).asBytes()) {
      kj::Vector<kj::String> changes;
      for (int i = 0; i <= SIGRTMAX; i++) {
        if (sigismember(&currentMask, i) && !sigismember(&originalMask, i)) {
          changes.add(kj::str("signal #", i, " (", strsignal(i), ") was added"));
        } else if (!sigismember(&currentMask, i) && sigismember(&originalMask, i)) {
          changes.add(kj::str("signal #", i, " (", strsignal(i), ") was removed"));
        }
      }

      KJ_FAIL_REQUIRE(
          "Signal mask has changed since UnixEventPort was constructed. You are required to "
          "ensure that whenever control returns to the event loop, the signal mask is the same "
          "as it was when UnixEventPort was created. In non-debug builds, this check is skipped, "
          "and this situation may instead lead to unexpected results. In particular, while the "
          "system is waiting for I/O events, the signal mask may be reverted to what it was at "
          "construction time, ignoring your subsequent changes.", changes);
    }
  }
#endif

  int timeout = timerImpl.timeoutToNextEvent(clock.now(), MILLISECONDS, int(maxValue))
          .map([](uint64_t t) -> int { return t; })
          .orDefault(-1);

  struct epoll_event events[16];
  int n;
  if (signalHead != nullptr || childSet != kj::none) {
    // We are interested in some signals. Use epoll_pwait().
    //
    // Note: Once upon a time, we used signalfd for this. However, this turned out to be more
    // trouble than it was worth. Some problems with signalfd:
    // - It required opening an additional file descriptor per thread.
    // - If the set of interesting signals changed, the signalfd would have to be updated before
    //   calling epoll_wait(), which was an extra syscall.
    // - When a signal arrives, it requires extra syscalls to read the signal info from the
    //   signalfd, as well as code to translate from signalfd_siginfo to siginfo_t, which are
    //   different for some reason.
    // - signalfd suffers from surprising lock contention during epoll_wait or when the signalfd's
    //   mask is updated in programs with many threads. Because the lock is a spinlock, this
    //   could consume exorbitant CPU.
    // - When a signalfd is in an epoll, it will be flagged readable based on signals which are
    //   pending in the process/thread which called epoll_ctl_add() to register the signalfd.
    //   This is mostly fine for our usage, except that it breaks one useful case that otherwise
    //   works: many servers are designed to "daemonize" themselves by fork()ing and then having
    //   the parent process exit while the child thread lives on. In this case, if a UnixEventPort
    //   had been created before daemonizing, signal handling would be forever broken in the child.

    sigset_t waitMask = originalMask;

    // Unblock the signals we care about.
    {
      auto ptr = signalHead;
      while (ptr != nullptr) {
        KJ_SYSCALL(sigdelset(&waitMask, ptr->signum));
        ptr = ptr->next;
      }
      if (childSet != kj::none) {
        KJ_SYSCALL(sigdelset(&waitMask, SIGCHLD));
      }
    }

    threadEventPort = this;
    n = epoll_pwait(epollFd, events, kj::size(events), timeout, &waitMask);
    threadEventPort = nullptr;
  } else {
    // Not waiting on any signals. Regular epoll_wait() will be fine.
    n = epoll_wait(epollFd, events, kj::size(events), timeout);
  }

  if (n < 0) {
    int error = errno;
    if (error == EINTR) {
      // We received a signal. The signal handler may have queued an event to the event loop. Even
      // if it didn't, we can't simply restart the epoll call because we need to recompute the
      // timeout. Instead, we pretend epoll_wait() returned zero events. This will cause the event
      // loop to spin once, decide it has nothing to do, recompute timeouts, then return to waiting.
      n = 0;
    } else {
      KJ_FAIL_SYSCALL("epoll_pwait()", error);
    }
  }

  return processEpollEvents(events, n);
}